

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdevice_p.h
# Opt level: O2

void __thiscall QInputDevicePrivate::setAvailableVirtualGeometry(QInputDevicePrivate *this,QRect a)

{
  QRect *r2;
  bool bVar1;
  long in_FS_OFFSET;
  QRect QVar2;
  QRect local_28;
  long local_18;
  
  local_28._8_8_ = a._8_8_;
  local_28._0_8_ = a._0_8_;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  r2 = (QRect *)(this + 0xc0);
  bVar1 = comparesEqual(&local_28,r2);
  if (!bVar1) {
    r2->x1 = (Representation)local_28.x1.m_i;
    r2->y1 = (Representation)local_28.y1.m_i;
    *(undefined8 *)(this + 200) = local_28._8_8_;
    setCapabilities(this,(Capabilities)(*(uint *)(this + 0xe0) | 0x20));
    QVar2._8_8_ = *(undefined8 *)(this + 0xc0);
    QVar2._0_8_ = *(undefined8 *)(this + 8);
    QInputDevice::availableVirtualGeometryChanged(QVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setAvailableVirtualGeometry(QRect a)
    {
        if (a == availableVirtualGeometry)
            return;

        availableVirtualGeometry = a;
        setCapabilities(capabilities | QInputDevice::Capability::NormalizedPosition);
        Q_Q(QInputDevice);
        Q_EMIT q->availableVirtualGeometryChanged(availableVirtualGeometry);
    }